

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_rand.c
# Opt level: O0

int BN_generate_dsa_nonce
              (BIGNUM *out,BIGNUM *range,BIGNUM *priv,uchar *message,size_t message_len,BN_CTX *ctx)

{
  int iVar1;
  uint num;
  OSSL_LIB_CTX *pOVar2;
  BIGNUM *pBVar3;
  void *in_RCX;
  BIGNUM *in_RSI;
  BIGNUM *in_RDI;
  size_t in_R8;
  BN_CTX *in_R9;
  OSSL_LIB_CTX *libctx;
  EVP_MD *md;
  int ret;
  uchar *k_bytes;
  uchar private_bytes [96];
  uint num_k_bytes;
  uint todo;
  uint done;
  uchar digest [64];
  uchar random_bytes [64];
  EVP_MD_CTX *mdctx;
  EVP_MD *md_00;
  undefined4 in_stack_fffffffffffffec8;
  int line;
  OSSL_LIB_CTX *ctx_00;
  size_t in_stack_fffffffffffffed8;
  uchar *in_stack_fffffffffffffee0;
  OSSL_LIB_CTX *in_stack_fffffffffffffee8;
  uint local_c0;
  uint local_bc;
  uchar local_b8 [48];
  undefined1 local_78 [64];
  EVP_MD_CTX *local_38;
  BN_CTX *local_30;
  size_t local_28;
  void *local_20;
  BIGNUM *local_10;
  BIGNUM *local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_38 = EVP_MD_CTX_new();
  iVar1 = BN_num_bits(local_10);
  num = (iVar1 + 7) / 8 + 8;
  ctx_00 = (OSSL_LIB_CTX *)0x0;
  line = 0;
  md_00 = (EVP_MD *)0x0;
  pOVar2 = ossl_bn_get_libctx(local_30);
  iVar1 = (int)((ulong)pOVar2 >> 0x20);
  if ((local_38 != (EVP_MD_CTX *)0x0) &&
     (ctx_00 = (OSSL_LIB_CTX *)CRYPTO_malloc(num,"crypto/bn/bn_rand.c",0x10d),
     ctx_00 != (OSSL_LIB_CTX *)0x0)) {
    iVar1 = BN_bn2binpad((BIGNUM *)CONCAT44(line,in_stack_fffffffffffffec8),(uchar *)md_00,iVar1);
    if (iVar1 < 0) {
      ERR_new();
      ERR_set_debug((char *)ctx_00,line,(char *)md_00);
      ERR_set_error(3,0x75,(char *)0x0);
    }
    else {
      md_00 = EVP_MD_fetch(ctx_00,(char *)CONCAT44(line,in_stack_fffffffffffffec8),(char *)md_00);
      if (md_00 == (EVP_MD *)0x0) {
        ERR_new();
        ERR_set_debug((char *)ctx_00,line,(char *)md_00);
        ERR_set_error(3,0x78,(char *)0x0);
      }
      else {
        for (local_bc = 0; local_bc < num; local_bc = local_c0 + local_bc) {
          iVar1 = RAND_priv_bytes_ex(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                                     in_stack_fffffffffffffed8,(uint)((ulong)ctx_00 >> 0x20));
          if (((((iVar1 < 1) ||
                (iVar1 = EVP_DigestInit_ex((EVP_MD_CTX *)local_38,(EVP_MD *)md_00,(ENGINE *)0x0),
                iVar1 == 0)) ||
               (iVar1 = EVP_DigestUpdate((EVP_MD_CTX *)local_38,&local_bc,4), iVar1 == 0)) ||
              ((iVar1 = EVP_DigestUpdate((EVP_MD_CTX *)local_38,&stack0xfffffffffffffed8,0x60),
               iVar1 == 0 ||
               (iVar1 = EVP_DigestUpdate((EVP_MD_CTX *)local_38,local_20,local_28), iVar1 == 0))))
             || ((iVar1 = EVP_DigestUpdate((EVP_MD_CTX *)local_38,local_78,0x40), iVar1 == 0 ||
                 (iVar1 = EVP_DigestFinal_ex((EVP_MD_CTX *)local_38,local_b8,(uint *)0x0),
                 iVar1 == 0)))) goto LAB_0022aef9;
          local_c0 = num - local_bc;
          if (0x40 < local_c0) {
            local_c0 = 0x40;
          }
          memcpy((void *)((long)((ctx_00->global).ex_data + -4) + (ulong)local_bc),local_b8,
                 (ulong)local_c0);
        }
        pBVar3 = BN_bin2bn((uchar *)ctx_00,num,local_8);
        if ((pBVar3 != (BIGNUM *)0x0) &&
           (iVar1 = BN_div((BIGNUM *)0x0,local_8,local_8,local_10,(BN_CTX *)local_30), iVar1 == 1))
        {
          line = 1;
        }
      }
    }
  }
LAB_0022aef9:
  EVP_MD_CTX_free((EVP_MD_CTX *)0x22af06);
  EVP_MD_free(md_00);
  CRYPTO_free(ctx_00);
  OPENSSL_cleanse(&stack0xfffffffffffffed8,0x60);
  return line;
}

Assistant:

int BN_generate_dsa_nonce(BIGNUM *out, const BIGNUM *range,
                          const BIGNUM *priv, const unsigned char *message,
                          size_t message_len, BN_CTX *ctx)
{
    EVP_MD_CTX *mdctx = EVP_MD_CTX_new();
    /*
     * We use 512 bits of random data per iteration to ensure that we have at
     * least |range| bits of randomness.
     */
    unsigned char random_bytes[64];
    unsigned char digest[SHA512_DIGEST_LENGTH];
    unsigned done, todo;
    /* We generate |range|+8 bytes of random output. */
    const unsigned num_k_bytes = BN_num_bytes(range) + 8;
    unsigned char private_bytes[96];
    unsigned char *k_bytes = NULL;
    int ret = 0;
    EVP_MD *md = NULL;
    OSSL_LIB_CTX *libctx = ossl_bn_get_libctx(ctx);

    if (mdctx == NULL)
        goto err;

    k_bytes = OPENSSL_malloc(num_k_bytes);
    if (k_bytes == NULL)
        goto err;

    /* We copy |priv| into a local buffer to avoid exposing its length. */
    if (BN_bn2binpad(priv, private_bytes, sizeof(private_bytes)) < 0) {
        /*
         * No reasonable DSA or ECDSA key should have a private key this
         * large and we don't handle this case in order to avoid leaking the
         * length of the private key.
         */
        ERR_raise(ERR_LIB_BN, BN_R_PRIVATE_KEY_TOO_LARGE);
        goto err;
    }

    md = EVP_MD_fetch(libctx, "SHA512", NULL);
    if (md == NULL) {
        ERR_raise(ERR_LIB_BN, BN_R_NO_SUITABLE_DIGEST);
        goto err;
    }
    for (done = 0; done < num_k_bytes;) {
        if (RAND_priv_bytes_ex(libctx, random_bytes, sizeof(random_bytes), 0) <= 0)
            goto err;

        if (!EVP_DigestInit_ex(mdctx, md, NULL)
                || !EVP_DigestUpdate(mdctx, &done, sizeof(done))
                || !EVP_DigestUpdate(mdctx, private_bytes,
                                     sizeof(private_bytes))
                || !EVP_DigestUpdate(mdctx, message, message_len)
                || !EVP_DigestUpdate(mdctx, random_bytes, sizeof(random_bytes))
                || !EVP_DigestFinal_ex(mdctx, digest, NULL))
            goto err;

        todo = num_k_bytes - done;
        if (todo > SHA512_DIGEST_LENGTH)
            todo = SHA512_DIGEST_LENGTH;
        memcpy(k_bytes + done, digest, todo);
        done += todo;
    }

    if (!BN_bin2bn(k_bytes, num_k_bytes, out))
        goto err;
    if (BN_mod(out, out, range, ctx) != 1)
        goto err;
    ret = 1;

 err:
    EVP_MD_CTX_free(mdctx);
    EVP_MD_free(md);
    OPENSSL_free(k_bytes);
    OPENSSL_cleanse(private_bytes, sizeof(private_bytes));
    return ret;
}